

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkylineBinPack.cpp
# Opt level: O1

int __thiscall
SkylineBinPack::ComputeWastedArea
          (SkylineBinPack *this,int skylineNodeIndex,int width,int height,int y)

{
  SkylineNode *pSVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int *piVar8;
  int iVar9;
  
  uVar2 = (this->skyLine).Count;
  iVar5 = 0;
  iVar6 = uVar2 - skylineNodeIndex;
  if (iVar6 != 0 && skylineNodeIndex <= (int)uVar2) {
    pSVar1 = (this->skyLine).Array + skylineNodeIndex;
    piVar8 = &pSVar1->width;
    iVar3 = pSVar1->x;
    iVar7 = width + iVar3;
    iVar5 = 0;
    do {
      iVar4 = ((SkylineNode *)(piVar8 + -2))->x;
      if (iVar7 <= iVar4) {
        return iVar5;
      }
      iVar9 = *piVar8 + iVar4;
      if (iVar9 <= iVar3) {
        return iVar5;
      }
      if (y < piVar8[-1]) {
        __assert_fail("y >= skyLine[skylineNodeIndex].y",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/SkylineBinPack.cpp"
                      ,0xa2,"int SkylineBinPack::ComputeWastedArea(int, int, int, int) const");
      }
      if (iVar7 < iVar9) {
        iVar9 = iVar7;
      }
      iVar5 = iVar5 + (y - piVar8[-1]) * (iVar9 - iVar4);
      piVar8 = piVar8 + 3;
      iVar6 = iVar6 + -1;
    } while (iVar6 != 0);
  }
  return iVar5;
}

Assistant:

int SkylineBinPack::ComputeWastedArea(int skylineNodeIndex, int width, int height, int y) const
{
	int wastedArea = 0;
	const int rectLeft = skyLine[skylineNodeIndex].x;
	const int rectRight = rectLeft + width;
	for(; skylineNodeIndex < (int)skyLine.Size() && skyLine[skylineNodeIndex].x < rectRight; ++skylineNodeIndex)
	{
		if (skyLine[skylineNodeIndex].x >= rectRight || skyLine[skylineNodeIndex].x + skyLine[skylineNodeIndex].width <= rectLeft)
			break;

		int leftSide = skyLine[skylineNodeIndex].x;
		int rightSide = MIN(rectRight, leftSide + skyLine[skylineNodeIndex].width);
		assert(y >= skyLine[skylineNodeIndex].y);
		wastedArea += (rightSide - leftSide) * (y - skyLine[skylineNodeIndex].y);
	}
	return wastedArea;
}